

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_serializer.cpp
# Opt level: O2

void __thiscall Net::UnZip(Net *this,string *FileName)

{
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *this_00;
  pointer pvVar1;
  long *plVar2;
  long lVar3;
  pointer pvVar4;
  char cVar5;
  FUNCTIONS FVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  allocator_type local_2b1;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  size_type local_288;
  Net *local_280;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *local_278;
  vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
  *local_270;
  vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
  *local_268;
  long local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  ifstream in;
  
  std::ifstream::ifstream(&in,(string *)FileName,_S_bin);
  cVar5 = std::__basic_file<char>::is_open();
  if (cVar5 != '\0') {
    FVar6 = net_serializer<int,_void>::deserialize((istream *)&in);
    this->function_type = FVar6;
    iVar7 = net_serializer<int,_void>::deserialize((istream *)&in);
    net_serializer<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_void>
    ::deserialize((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   *)&local_2a8,(istream *)&in);
    local_278 = &this->biases;
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::_M_move_assign(local_278,&local_2a8);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               *)&local_2a8);
    net_serializer<std::vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>,_void>
    ::deserialize((vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                   *)&local_2a8,(istream *)&in);
    local_270 = &this->weights;
    std::
    vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
    ::_M_move_assign(local_270,&local_2a8);
    std::
    vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
    ::~vector((vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
               *)&local_2a8);
    local_268 = &this->init;
    std::
    vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
    ::resize(local_268,
             ((long)(this->weights).
                    super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->weights).
                   super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start) / 0x18);
    local_2b0 = &this->mesh;
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::resize(local_2b0,
             ((long)(this->biases).
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->biases).
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start) / 0x18);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::resize(&this->init_biases,
             ((long)(this->biases).
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->biases).
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start) / 0x18);
    local_288 = (size_type)iVar7;
    lVar9 = 0;
    local_280 = this;
    for (lVar8 = 0;
        lVar8 < (int)(((long)(this->biases).
                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->biases).
                            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start) / 0x18); lVar8 = lVar8 + 1) {
      this_00 = (local_268->
                super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      if (lVar9 == 0) {
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::resize(this_00,0);
        local_2a8._M_dataplus._M_p = (pointer)0x0;
        std::vector<double,_std::allocator<double>_>::_M_fill_assign
                  ((local_2b0->
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start,local_288,
                   (value_type_conflict2 *)&local_2a8);
        local_2a8._M_dataplus._M_p = (pointer)0x0;
        std::vector<double,_std::allocator<double>_>::_M_fill_assign
                  ((this->init_biases).
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                   ((long)(this->biases).
                          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->biases).
                         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start) / 0x18,
                   (value_type_conflict2 *)&local_2a8);
      }
      else {
        pvVar1 = (local_270->
                 super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        plVar2 = *(long **)((long)&(pvVar1->
                                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                   )._M_impl.super__Vector_impl_data + lVar9);
        lVar3 = *(long *)((long)&(pvVar1->
                                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                 )._M_impl.super__Vector_impl_data + lVar9 + 8);
        local_258._M_dataplus._M_p = (pointer)0x0;
        local_260 = lVar8;
        std::vector<double,_std::allocator<double>_>::vector
                  ((vector<double,_std::allocator<double>_> *)&local_2a8,plVar2[1] - *plVar2 >> 3,
                   (value_type_conflict2 *)&local_258,&local_2b1);
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::_M_fill_assign((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                          *)((long)&(this_00->
                                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + lVar9),
                         (lVar3 - (long)plVar2) / 0x18,(value_type *)&local_2a8);
        std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                  ((_Vector_base<double,_std::allocator<double>_> *)&local_2a8);
        pvVar4 = (local_278->
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        local_2a8._M_dataplus._M_p = (pointer)0x0;
        std::vector<double,_std::allocator<double>_>::_M_fill_assign
                  ((vector<double,_std::allocator<double>_> *)
                   ((long)&(((local_2b0->
                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start)->
                           super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                           super__Vector_impl_data + lVar9),
                   *(long *)((long)&(pvVar4->super__Vector_base<double,_std::allocator<double>_>).
                                    _M_impl.super__Vector_impl_data + lVar9 + 8) -
                   *(long *)((long)&(pvVar4->super__Vector_base<double,_std::allocator<double>_>).
                                    _M_impl.super__Vector_impl_data + lVar9) >> 3,
                   (value_type_conflict2 *)&local_2a8);
        lVar8 = local_260;
        this = local_280;
        local_2a8._M_dataplus._M_p = (pointer)0x0;
        std::vector<double,_std::allocator<double>_>::_M_fill_assign
                  ((vector<double,_std::allocator<double>_> *)
                   ((long)&(((local_280->init_biases).
                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->
                           super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                           super__Vector_impl_data + lVar9),
                   ((long)(local_280->biases).
                          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(local_280->biases).
                         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start) / 0x18,
                   (value_type_conflict2 *)&local_2a8);
      }
      lVar9 = lVar9 + 0x18;
    }
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::operator=(&this->meshZ,local_2b0);
    std::ifstream::~ifstream(&in);
    return;
  }
  std::operator+(&local_258,"File ",FileName);
  std::operator+(&local_2a8,&local_258," can\'t be written to\n");
  std::operator<<((ostream *)&std::cerr,(string *)&local_2a8);
  std::__cxx11::string::~string((string *)&local_2a8);
  std::__cxx11::string::~string((string *)&local_258);
  exit(1);
}

Assistant:

void Net::UnZip(const std::string& FileName){
    std::ifstream in(FileName, std::ios::binary);
    if (!in.is_open()){
        std::cerr << "File "+FileName+" can't be written to\n";
        exit(EXIT_FAILURE);
    }
    function_type = (FUNCTIONS)net_serializer<int>::deserialize(in);
    int input = net_serializer<int>::deserialize(in);
    biases = net_serializer<decltype(biases)>::deserialize(in);
    weights = net_serializer<decltype(weights)>::deserialize(in);

    init.resize(weights.size());
    mesh.resize(biases.size());
    init_biases.resize(biases.size());
    for (int i = 0; i < (int)biases.size(); ++i){
        if (i == 0) {
            init[i].resize(0);
            mesh[i].assign(input, 0);
            init_biases[i].assign(biases.size(), 0);
        }else {
            init[i].assign(weights[i].size(), Layer(weights[i][0].size(), 0));
            mesh[i].assign(biases[i].size(), 0);
            init_biases[i].assign(biases.size(), 0);
        }
    }
    meshZ = mesh;
}